

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

void __thiscall
vkt::memory::anon_unknown_0::DestroyBuffer::execute(DestroyBuffer *this,ExecuteContext *context)

{
  DeviceInterface *pDVar1;
  VkDevice pVVar2;
  deUint64 dVar3;
  _func_int *UNRECOVERED_JUMPTABLE;
  
  pDVar1 = context->m_context->m_vkd;
  pVVar2 = context->m_context->m_device;
  dVar3 = (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  UNRECOVERED_JUMPTABLE = pDVar1->_vptr_DeviceInterface[0x22];
  (*UNRECOVERED_JUMPTABLE)(pDVar1,pVVar2,dVar3,0,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

const Context&	getContext		(void) const { return m_context; }